

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar4;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar5;
  value_type vVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  vVar6 = FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  dVar7 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar3 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar1 = (this->right_->fadexpr_).expr_.fadexpr_.left_.constant_;
  dVar2 = (pFVar3->dx_).ptr_to_data[i];
  dVar8 = cos(dVar1 * pFVar3->val_);
  pFVar4 = this->left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  dVar9 = sin((pFVar5->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((pFVar5->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar5 = (pFVar4->fadexpr_).right_;
  dVar10 = sin((pFVar5->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((pFVar5->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar10 * dVar9 * dVar8 * dVar2 * dVar1 + dVar7 * vVar6;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}